

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

int mbedtls_des_key_check_weak(uchar *key)

{
  int local_1c;
  int i;
  uchar *key_local;
  
  local_1c = 0;
  while( true ) {
    if (0xf < local_1c) {
      return 0;
    }
    if (weak_key_table[local_1c] == *(uchar (*) [8])key) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

int mbedtls_des_key_check_weak( const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    for( i = 0; i < WEAK_KEY_COUNT; i++ )
        if( memcmp( weak_key_table[i], key, MBEDTLS_DES_KEY_SIZE) == 0 )
            return( 1 );

    return( 0 );
}